

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuBar.cpp
# Opt level: O2

size_t __thiscall gui::MenuBar::findMenuIndex(MenuBar *this,String *name)

{
  pointer pMVar1;
  bool bVar2;
  out_of_range *this_00;
  long lVar3;
  size_t i;
  ulong uVar4;
  
  lVar3 = 0;
  uVar4 = 0;
  while( true ) {
    pMVar1 = (this->menus_).super__Vector_base<gui::MenuList,_std::allocator<gui::MenuList>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->menus_).
                       super__Vector_base<gui::MenuList,_std::allocator<gui::MenuList>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pMVar1) / 0x50) <= uVar4) {
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(this_00,"MenuBar::findMenuIndex");
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    bVar2 = sf::operator==((String *)((long)&(pMVar1->name).m_string._M_dataplus + lVar3),name);
    if (bVar2) break;
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x50;
  }
  return uVar4;
}

Assistant:

size_t MenuBar::findMenuIndex(const sf::String& name) const {
    for (size_t i = 0; i < menus_.size(); ++i) {
        if (menus_[i].name == name) {
            return i;
        }
    }
    throw std::out_of_range("MenuBar::findMenuIndex");
}